

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointPoint.cpp
# Opt level: O1

void __thiscall chrono::fea::ChLinkPointPoint::ChLinkPointPoint(ChLinkPointPoint *this)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  
  ChObj::ChObj((ChObj *)this);
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChLinkBase).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = auVar1;
  (this->super_ChLinkBase).super_ChPhysicsItem.system = (ChSystem *)auVar1._0_8_;
  (this->super_ChLinkBase).super_ChPhysicsItem.vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar1._8_16_;
  (this->super_ChLinkBase).super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1._24_8_;
  *(undefined2 *)&(this->super_ChLinkBase).super_ChPhysicsItem.field_0x74 = 0x100;
  (this->super_ChLinkBase).super_ChPhysicsItem.field_0x76 = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkPointPoint_00b50860;
  (this->react).m_data[0] = VNULL;
  (this->react).m_data[1] = DAT_00b90ac0;
  (this->react).m_data[2] = DAT_00b90ac8;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  auVar2 = ZEXT816(0) << 0x20;
  (this->constraint1).super_ChConstraintTwo.variables_a = (ChVariables *)auVar2._0_8_;
  (this->constraint1).super_ChConstraintTwo.variables_b = (ChVariables *)auVar2._8_8_;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b62c70;
  (this->constraint1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint1).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint1).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint1).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint1).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint2).super_ChConstraintTwo.variables_a = (ChVariables *)auVar2._0_8_;
  (this->constraint2).super_ChConstraintTwo.variables_b = (ChVariables *)auVar2._8_8_;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b62c70;
  (this->constraint2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint2).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint2).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint2).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint2).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraint_00b629f0;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint3).super_ChConstraintTwo.variables_a = (ChVariables *)auVar2._0_8_;
  (this->constraint3).super_ChConstraintTwo.variables_b = (ChVariables *)auVar2._8_8_;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b62c70;
  (this->constraint3).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint3).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint3).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint3).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mnodeB).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mnodeB).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->constraint3).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint3).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint3).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint3).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint3).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint3).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint3).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint3).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  return;
}

Assistant:

ChLinkPointPoint::ChLinkPointPoint() : react(VNULL) {}